

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O1

void __thiscall polyscope::render::Engine::loadDefaultMaterials(Engine *this)

{
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"clay","");
  loadDefaultMaterial(this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"wax","");
  loadDefaultMaterial(this,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"candy","");
  loadDefaultMaterial(this,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"flat","");
  loadDefaultMaterial(this,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"mud","");
  loadDefaultMaterial(this,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"ceramic","");
  loadDefaultMaterial(this,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"jade","");
  loadDefaultMaterial(this,&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"normal","");
  loadDefaultMaterial(this,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Engine::loadDefaultMaterials() {
  loadDefaultMaterial("clay");
  loadDefaultMaterial("wax");
  loadDefaultMaterial("candy");
  loadDefaultMaterial("flat");
  loadDefaultMaterial("mud");
  loadDefaultMaterial("ceramic");
  loadDefaultMaterial("jade");
  loadDefaultMaterial("normal");
}